

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.cpp
# Opt level: O2

WindowHandle create_window(string *title,int x,int y,int w,int h)

{
  _Head_base<0UL,_std::thread_*,_false> __p;
  byte bVar1;
  WindowHandleData *this;
  thread *this_00;
  condition_variable *pcVar2;
  WindowHandleData *local_70;
  int local_68;
  int local_64;
  _Head_base<0UL,_std::thread_*,_false> local_60;
  string *local_58;
  int local_4c;
  int local_48;
  int local_44;
  unique_lock<std::mutex> local_40;
  
  local_68 = h;
  local_58 = title;
  if ((anonymous_namespace)::XThreads_initialized == '\0') {
    XInitThreads();
    (anonymous_namespace)::XThreads_initialized = '\x01';
  }
  this = (WindowHandleData *)operator_new(0xd8);
  memset(this,0,0xd8);
  WindowHandleData::WindowHandleData(this);
  this->display = (Display *)0x0;
  this->pix_w = 0;
  this->pix_h = 0;
  this->listener = (IWindowListener *)0x0;
  this->w = 0;
  this->h = 0;
  this->im = (XImage *)0x0;
  this->data = (char *)0x0;
  this->bytes = (uint32_t *)0x0;
  this->x = x;
  this->y = y;
  this->channels = 0;
  local_4c = local_68;
  this->initialised = false;
  local_70 = this;
  local_64 = w;
  local_48 = y;
  local_44 = x;
  this_00 = (thread *)operator_new(8);
  std::thread::
  thread<void(&)(WindowHandleData*,std::__cxx11::string_const&,int,int,int,int),WindowHandleData*&,std::__cxx11::string_const&,int&,int&,int&,int&,void>
            (this_00,anon_unknown.dwarf_14272::_create_window_with_message_loop,&local_70,local_58,
             &local_44,&local_48,&local_64,&local_4c);
  local_60._M_head_impl = this_00;
  std::unique_lock<std::mutex>::unique_lock(&local_40,&local_70->mt);
  if (local_70->initialised == false) {
    pcVar2 = &local_70->cv;
    bVar1 = 0;
    while ((bVar1 & 1) == 0) {
      std::condition_variable::wait((unique_lock *)pcVar2);
      bVar1 = local_70->initialised;
    }
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_40);
  __p._M_head_impl = local_60._M_head_impl;
  local_60._M_head_impl = (thread *)0x0;
  std::__uniq_ptr_impl<std::thread,_std::default_delete<std::thread>_>::reset
            ((__uniq_ptr_impl<std::thread,_std::default_delete<std::thread>_> *)&this->t,
             __p._M_head_impl);
  std::unique_ptr<std::thread,_std::default_delete<std::thread>_>::~unique_ptr
            ((unique_ptr<std::thread,_std::default_delete<std::thread>_> *)&local_60);
  return this;
}

Assistant:

WindowHandle create_window(const std::string& title, int x, int y, int w, int h)
  {
#ifdef _WIN32
  WindowHandle handle = new WindowHandleData();
  handle->h_wnd = nullptr;
  handle->bytes = nullptr;
#else
  if (!XThreads_initialized)
    {
    XInitThreads(); // This should be called exactly once at the beginning of an XLib multithreaded application.
    XThreads_initialized = true;
    }
  WindowHandle handle = new WindowHandleData();
  handle->display = nullptr;
  handle->im = nullptr;
  handle->pix_w = 0;
  handle->pix_h = 0;
  handle->data = nullptr;
  handle->bytes = nullptr;
#endif
  handle->listener = nullptr;
  handle->w = 0;
  handle->h = 0;
  handle->x = x;
  handle->y = y;
  handle->channels = 0;
#ifdef _WIN32
  handle->t = _create_threaded_window(&(handle->h_wnd), handle, title, x, y, w, h);
#else
  handle->t = _create_threaded_window(handle, title, x, y, w, h);
#endif
  return handle;
  }